

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O1

void __thiscall cppnet::RWSocket::AddTimer(RWSocket *this,uint32_t interval,bool always)

{
  int iVar1;
  Dispatcher *this_00;
  int iVar2;
  uint32_t uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar4;
  shared_ptr<cppnet::RWSocket> sStack_38;
  
  if (this->_timer_id == 0) {
    this_01 = (this->super_Socket)._dispatcher.
              super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar2 = this_01->_M_use_count;
      do {
        if (iVar2 == 0) {
          this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar1 = this_01->_M_use_count;
        bVar4 = iVar2 == iVar1;
        if (bVar4) {
          this_01->_M_use_count = iVar2 + 1;
          iVar1 = iVar2;
        }
        iVar2 = iVar1;
        UNLOCK();
      } while (!bVar4);
    }
    if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = this_01->_M_use_count == 0;
    }
    this_00 = (this->super_Socket)._dispatcher.
              super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (!(bool)(this_00 == (Dispatcher *)0x0 | bVar4)) {
      std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cppnet::RWSocket,void>
                ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&sStack_38,
                 (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<cppnet::RWSocket>);
      uVar3 = Dispatcher::AddTimer(this_00,&sStack_38,interval,always);
      this->_timer_id = uVar3;
      if (sStack_38.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (sStack_38.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  return;
}

Assistant:

void RWSocket::AddTimer(uint32_t interval, bool always) {
    if (_timer_id > 0) {
        return;
    }
    
    auto dispatcher = GetDispatcher();
    if (dispatcher) {
        _timer_id = dispatcher->AddTimer(shared_from_this(), interval, always);
    }
}